

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjsonext.cpp
# Opt level: O2

void __thiscall trun::ResultsReportJSONExtensive::DumpNewStruct(ResultsReportJSONExtensive *this)

{
  int iVar1;
  ResultSummary *pRVar2;
  bool bVar3;
  long lVar4;
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  initializer_list<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_106;
  less<trun::kTestResult> local_105;
  anon_enum_8 local_104 [4];
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  testFunctions;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  results;
  shared_ptr<trun::TestFunc> testFunction;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if ((((this->super_ResultsReportJSON).bHadFailures != false) ||
      ((this->super_ResultsReportJSON).bHadSummary != false)) ||
     ((this->super_ResultsReportJSON).bHadSuccess == true)) {
    ResultsReportPinterBase::WriteNoIndent((ResultsReportPinterBase *)this,",\n");
  }
  pRVar2 = ResultSummary::Instance();
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  vector(&results,&pRVar2->results);
  pRVar2 = ResultSummary::Instance();
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  vector(&testFunctions,&pRVar2->testFunctions);
  if (DumpNewStruct()::resultToName_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&DumpNewStruct()::resultToName_abi_cxx11_);
    if (iVar1 != 0) {
      local_104[3] = 0;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[5],_true>
                ((pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&testFunction,local_104 + 3,(char (*) [5])"Pass");
      local_104[2] = 3;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[8],_true>
                (&local_a8,local_104 + 2,(char (*) [8])"AllFail");
      local_104[1] = 2;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[11],_true>
                (&local_80,local_104 + 1,(char (*) [11])"ModuleFail");
      local_104[0] = kTestResult_TestFail;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[9],_true>
                (&local_58,local_104,(char (*) [9])"TestFail");
      __l._M_len = 4;
      __l._M_array = (iterator)&testFunction;
      std::
      map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&DumpNewStruct()::resultToName_abi_cxx11_,__l,&local_105,&local_106);
      lVar4 = 0x80;
      do {
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&testFunction.
                           super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   lVar4));
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != -0x20);
      __cxa_atexit(std::
                   map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&DumpNewStruct()::resultToName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DumpNewStruct()::resultToName_abi_cxx11_);
    }
  }
  ResultsReportPinterBase::WriteLine((ResultsReportPinterBase *)this,"\"Results\" : [");
  ResultsReportPinterBase::PushIndent((ResultsReportPinterBase *)this);
  bVar3 = false;
  for (p_Var5 = &(testFunctions.
                  super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != &(testFunctions.
                  super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>; p_Var5 = p_Var5 + 1
      ) {
    std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&testFunction.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    if (bVar3) {
      ResultsReportPinterBase::WriteNoIndent((ResultsReportPinterBase *)this,",\n");
    }
    PrintFuncResult(this,(Ref *)&testFunction.
                                 super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&testFunction.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar3 = true;
  }
  ResultsReportPinterBase::PopIndent((ResultsReportPinterBase *)this);
  ResultsReportPinterBase::WriteLine((ResultsReportPinterBase *)this,"");
  ResultsReportPinterBase::Write((ResultsReportPinterBase *)this,"]");
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  ~vector(&testFunctions);
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  ~vector(&results);
  return;
}

Assistant:

void ResultsReportJSONExtensive::DumpNewStruct() {

    if (bHadFailures || bHadSummary || bHadSuccess) {
        WriteNoIndent(",\n");
    }

    auto results = ResultSummary::Instance().Results();
    auto testFunctions = ResultSummary::Instance().TestFunctions();

    static std::map<kTestResult, std::string> resultToName={
            {kTestResult_Pass, "Pass"},
            {kTestResult_AllFail, "AllFail"},
            {kTestResult_ModuleFail,"ModuleFail"},
            {kTestResult_TestFail, "TestFail"},
    };

    WriteLine(R"("Results" : [)");
    PushIndent();

    bool bNeedComma = false;
    for (auto testFunction : testFunctions) {
        if (bNeedComma) {
            WriteNoIndent(",\n");
        }
        PrintFuncResult(testFunction);
        bNeedComma = true;
    }
    PopIndent();
    WriteLine("");
    Write("]");
}